

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OricMFMDSK.cpp
# Opt level: O3

void __thiscall Storage::Disk::OricMFMDSK::OricMFMDSK(OricMFMDSK *this,string *file_name)

{
  FileHolder *this_00;
  bool bVar1;
  uint32_t uVar2;
  undefined4 *puVar3;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__OricMFMDSK_005a28a0;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  bVar1 = FileHolder::check_signature(this_00,"MFM_DISK",0);
  if (bVar1) {
    uVar2 = FileHolder::get32le(this_00);
    this->head_count_ = uVar2;
    uVar2 = FileHolder::get32le(this_00);
    this->track_count_ = uVar2;
    uVar2 = FileHolder::get32le(this_00);
    this->geometry_type_ = uVar2;
    if (0xfffffffd < uVar2 - 3) {
      return;
    }
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0xfffffffe;
  __cxa_throw(puVar3,&Error::typeinfo,0);
}

Assistant:

OricMFMDSK::OricMFMDSK(const std::string &file_name) :
		file_(file_name) {
	if(!file_.check_signature("MFM_DISK"))
		throw Error::InvalidFormat;

	head_count_ = file_.get32le();
	track_count_ = file_.get32le();
	geometry_type_ = file_.get32le();

	if(geometry_type_ < 1 || geometry_type_ > 2)
		throw Error::InvalidFormat;
}